

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O0

void amrex::Arena::PrintUsage(void)

{
  Arena *pAVar1;
  Arena *pAVar2;
  CArena *p_3;
  CArena *p_2;
  CArena *p_1;
  CArena *p;
  string *in_stack_000002e8;
  CArena *in_stack_000002f0;
  long local_150;
  long local_130;
  long local_108;
  long local_e0;
  allocator local_c9;
  string local_c8 [32];
  long local_a8;
  allocator local_99;
  string local_98 [32];
  long local_78;
  allocator local_69;
  string local_68 [32];
  long local_48;
  allocator local_29;
  string local_28 [32];
  long local_8;
  
  pAVar1 = The_Arena();
  if (pAVar1 != (Arena *)0x0) {
    pAVar1 = The_Arena();
    if (pAVar1 == (Arena *)0x0) {
      local_e0 = 0;
    }
    else {
      local_e0 = __dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
    }
    local_8 = local_e0;
    if (local_e0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_28,"The         Arena",&local_29);
      CArena::PrintUsage(in_stack_000002f0,in_stack_000002e8);
      std::__cxx11::string::~string(local_28);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
  }
  pAVar1 = The_Device_Arena();
  if (pAVar1 != (Arena *)0x0) {
    pAVar1 = The_Device_Arena();
    pAVar2 = The_Arena();
    if (pAVar1 != pAVar2) {
      pAVar1 = The_Device_Arena();
      if (pAVar1 == (Arena *)0x0) {
        local_108 = 0;
      }
      else {
        local_108 = __dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
      }
      local_48 = local_108;
      if (local_108 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"The  Device Arena",&local_69);
        CArena::PrintUsage(in_stack_000002f0,in_stack_000002e8);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
    }
  }
  pAVar1 = The_Managed_Arena();
  if (pAVar1 != (Arena *)0x0) {
    pAVar1 = The_Managed_Arena();
    pAVar2 = The_Arena();
    if (pAVar1 != pAVar2) {
      pAVar1 = The_Managed_Arena();
      if (pAVar1 == (Arena *)0x0) {
        local_130 = 0;
      }
      else {
        local_130 = __dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
      }
      local_78 = local_130;
      if (local_130 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"The Managed Arena",&local_99);
        CArena::PrintUsage(in_stack_000002f0,in_stack_000002e8);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
    }
  }
  pAVar1 = The_Pinned_Arena();
  if (pAVar1 != (Arena *)0x0) {
    pAVar1 = The_Pinned_Arena();
    if (pAVar1 == (Arena *)0x0) {
      local_150 = 0;
    }
    else {
      local_150 = __dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
    }
    local_a8 = local_150;
    if (local_150 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"The  Pinned Arena",&local_c9);
      CArena::PrintUsage(in_stack_000002f0,in_stack_000002e8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  return;
}

Assistant:

void
Arena::PrintUsage ()
{
#ifdef AMREX_USE_GPU
    const int IOProc = ParallelDescriptor::IOProcessorNumber();
    {
        Long min_megabytes = Gpu::Device::totalGlobalMem() / (1024*1024);
        Long max_megabytes = min_megabytes;
        ParallelDescriptor::ReduceLongMin(min_megabytes, IOProc);
        ParallelDescriptor::ReduceLongMax(max_megabytes, IOProc);
#ifdef AMREX_USE_MPI
        amrex::Print() << "Total GPU global memory (MB) spread across MPI: ["
                       << min_megabytes << " ... " << max_megabytes << "]\n";
#else
        amrex::Print() << "Total GPU global memory (MB): " << min_megabytes << "\n";
#endif
    }
    {
        Long min_megabytes = Gpu::Device::freeMemAvailable() / (1024*1024);
        Long max_megabytes = min_megabytes;
        ParallelDescriptor::ReduceLongMin(min_megabytes, IOProc);
        ParallelDescriptor::ReduceLongMax(max_megabytes, IOProc);
#ifdef AMREX_USE_MPI
        amrex::Print() << "Free  GPU global memory (MB) spread across MPI: ["
                       << min_megabytes << " ... " << max_megabytes << "]\n";
#else
        amrex::Print() << "Free  GPU global memory (MB): " << min_megabytes << "\n";
#endif
    }
#endif
    if (The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Arena());
        if (p) {
            p->PrintUsage("The         Arena");
        }
    }
    if (The_Device_Arena() && The_Device_Arena() != The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Device_Arena());
        if (p) {
            p->PrintUsage("The  Device Arena");
        }
    }
    if (The_Managed_Arena() && The_Managed_Arena() != The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Managed_Arena());
        if (p) {
            p->PrintUsage("The Managed Arena");
        }
    }
    if (The_Pinned_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Pinned_Arena());
        if (p) {
            p->PrintUsage("The  Pinned Arena");
        }
    }
}